

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_changedir(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  char *pcVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  LispPTR local_218c;
  int local_2188;
  OneDArray **local_2180;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  char host [255];
  char dir [4096];
  char lfname [4101];
  int rval;
  int dskp;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lfname._4096_4_ = pLVar2[2];
      stack0xffffffffffffffe4 = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lfname._4096_4_ = pLVar2[2] << 1;
      stack0xffffffffffffffe4 = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (stack0xffffffffffffffe4 == 0) {
      local_2188 = lfname._4096_4_ + 3;
    }
    else {
      local_2188 = lfname._4096_4_ + 5;
    }
    if (local_2188 < 0x1006) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_218c = pLVar2[2];
      }
      else {
        local_218c = 0x1000;
      }
      pcVar3 = (char *)(long)(int)local_218c;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(dir + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pcVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (dir + 0xff8)[(long)pcVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(dir + 0xff8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar3; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(dir + 0xff8,(char *)&lf_arrayp);
      for (local_2180 = &lf_arrayp; *(char *)local_2180 != '\0';
          local_2180 = (OneDArray **)((long)local_2180 + 1)) {
        if (('`' < *(char *)local_2180) && (*(char *)local_2180 < '{')) {
          *(char *)local_2180 = *(char *)local_2180 + -0x20;
        }
      }
      iVar1 = strcmp((char *)&lf_arrayp,"DSK");
      if (iVar1 == 0) {
        bVar6 = true;
      }
      else {
        iVar1 = strcmp((char *)&lf_arrayp,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        bVar6 = false;
      }
      iVar1 = unixpathname(dir + 0xff8,host + 0xf8,0,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else if ((bVar6) && (iVar1 = true_name(host + 0xf8), iVar1 != -1)) {
        args_local._4_4_ = 0;
      }
      else {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = chdir(host + 0xf8);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == 0) {
          args_local._4_4_ = 0x4c;
        }
        else {
          args_local._4_4_ = 0;
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_changedir(LispPTR *args)
{
  int dskp, rval;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, dir, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, dir, 0, 0)) return (NIL);
#endif /* DOS */

  if (dskp) {
    /*
     * If {DSK} device, the directory name can be specified in a case
     * insensitive manner.  We have to convert it into a right case.
     */
    if (true_name(dir) != -1) return (NIL);
  }

  TIMEOUT(rval = chdir(dir));
  if (rval != 0) return (NIL);
#ifdef DOS
  if (*drive) {
    if (*drive <= 'Z')
      rval = _chdrive(*drive - ('A' - 1));
    else
      rval = _chdrive(*drive - ('a' - 1));
    if (rval != 0) return (NIL);
  }
#endif /* DOS */
  return (ATOM_T);
}